

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

double calc_mean_only_weighted<float,unsigned_long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind
                 ,unsigned_long *Xc_indptr,vector<double,_std::allocator<double>_> *w)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar8;
  long in_stack_00000008;
  size_t *row_1;
  double w_this;
  double m;
  double added;
  size_t row;
  double cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  byte local_9a;
  ulong *local_98;
  unsigned_long *in_stack_ffffffffffffff70;
  unsigned_long *in_stack_ffffffffffffff78;
  unsigned_long *in_stack_ffffffffffffff80;
  unsigned_long *__first;
  ulong local_78;
  double local_70;
  long local_50;
  unsigned_long *local_8;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    local_8 = (unsigned_long *)0x0;
  }
  else {
    local_50 = *(long *)(in_stack_00000008 + in_RCX * 8);
    lVar1 = *(long *)(in_stack_00000008 + 8 + in_RCX * 8);
    lVar5 = lVar1 + -1;
    uVar2 = *(ulong *)(in_R9 + lVar5 * 8);
    local_98 = std::lower_bound<unsigned_long*,unsigned_long>
                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70);
    local_70 = 0.0;
    for (local_78 = in_RSI; local_78 <= in_RDX; local_78 = local_78 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)row_1,
                          *(size_type *)(in_RDI + local_78 * 8));
      local_70 = *pvVar6 + local_70;
    }
    __first = (unsigned_long *)0x0;
    local_8 = (unsigned_long *)0x0;
    while( true ) {
      bVar8 = false;
      if ((local_98 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar8 = false, local_50 != lVar1)) {
        bVar8 = *local_98 <= uVar2;
      }
      if (!bVar8) break;
      if (*(ulong *)(in_R9 + local_50 * 8) == *local_98) {
        uVar3 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
        local_9a = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
          local_9a = (byte)iVar4;
        }
        if ((local_9a & 1) == 0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)row_1,*local_98);
          in_stack_ffffffffffffff70 = (unsigned_long *)*pvVar6;
          __first = (unsigned_long *)((double)in_stack_ffffffffffffff70 + (double)__first);
          local_8 = (unsigned_long *)
                    (((double)in_stack_ffffffffffffff70 *
                     ((double)*(float *)(in_R8 + local_50 * 4) - (double)local_8)) / (double)__first
                    + (double)local_8);
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)row_1,*local_98);
          local_70 = local_70 - *pvVar6;
        }
        if ((local_98 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == lVar5)) break;
        local_98 = local_98 + 1;
        puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                           (__first,local_8,in_stack_ffffffffffffff70);
        local_50 = (long)puVar7 - in_R9 >> 3;
      }
      else if (*local_98 < *(ulong *)(in_R9 + local_50 * 8)) {
        local_98 = std::lower_bound<unsigned_long*,unsigned_long>
                             (__first,local_8,in_stack_ffffffffffffff70);
      }
      else {
        puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                           (__first,local_8,in_stack_ffffffffffffff70);
        local_50 = (long)puVar7 - in_R9 >> 3;
      }
    }
    if (((double)__first != 0.0) || (NAN((double)__first))) {
      if ((double)__first < local_70) {
        local_8 = (unsigned_long *)(((double)__first / local_70) * (double)local_8);
      }
    }
    else {
      local_8 = (unsigned_long *)0x0;
    }
  }
  return (double)local_8;
}

Assistant:

double calc_mean_only_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos]))) {
                cnt -= w[*row];
            }

            else {
                w_this = w[*row];
                added += w_this;
                m += w_this * (Xc[curr_pos] - m) / added;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= (ldouble_safe)added / (ldouble_safe)cnt;

    return m;
}